

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.h
# Opt level: O3

void __thiscall FIX::Session::reset(Session *this)

{
  int64_t *piVar1;
  UtcTimeStamp local_38;
  
  piVar1 = &local_38.super_DateTime.m_time;
  local_38.super_DateTime._vptr_DateTime = (_func_int **)piVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  FIX::Session::generateLogout((string *)this);
  if (local_38.super_DateTime._vptr_DateTime != (_func_int **)piVar1) {
    operator_delete(local_38.super_DateTime._vptr_DateTime,local_38.super_DateTime.m_time + 1);
  }
  FIX::Session::disconnect();
  if (*(long *)(this + 0x18) != 0) {
    (**(code **)(this + 0x20))(&local_38,this + 8);
    SessionState::reset((SessionState *)(this + 0x288),&local_38);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void reset() EXCEPT(IOException) {
    generateLogout();
    disconnect();
    m_state.reset(m_timestamper());
  }